

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

void * bc_malloc(size_t size)

{
  void *pvVar1;
  void *rv;
  size_t size_local;
  
  pvVar1 = malloc(size);
  if (pvVar1 == (void *)0x0) {
    fprintf(_stderr,"fatal: Failed to allocate memory!\n");
    abort();
  }
  return pvVar1;
}

Assistant:

void*
bc_malloc(size_t size)
{
    // simple things simple!
    void *rv = malloc(size);
    if (rv == NULL) {
        fprintf(stderr, "fatal: Failed to allocate memory!\n");
        abort();
    }
    return rv;
}